

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O0

void __thiscall
ConfusableMatcher::GetMappings
          (ConfusableMatcher *this,CMStringView Key,size_t KeyPos,CMStringView Value,size_t ValuePos
          ,StackVector<std::pair<unsigned_long,_unsigned_long>_> *Storage)

{
  byte bVar1;
  dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
  *this_00;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  byte *pbVar5;
  char *pcVar6;
  char *pcVar7;
  pointer ppVar8;
  ulong uVar9;
  pair<unsigned_long,_unsigned_long> local_d0;
  CMStringView local_c0;
  CMStringView local_b0;
  int local_9c;
  const_reference pvStack_98;
  int valLen;
  value_type *secondItem;
  vector<CMString,_std::allocator<CMString>_> *pvStack_88;
  int i;
  vector<CMString,_std::allocator<CMString>_> *secondVec;
  undefined1 local_68 [8];
  iterator foundArr;
  value_type *item;
  int x;
  vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
  *vec;
  size_t KeyPos_local;
  ConfusableMatcher *this_local;
  CMStringView Value_local;
  CMStringView Key_local;
  
  Value_local._M_len = (size_t)Value._M_str;
  this_local = (ConfusableMatcher *)Value._M_len;
  Value_local._M_str = (char *)Key._M_len;
  sVar4 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&Value_local._M_str);
  if (sVar4 == KeyPos) {
    __assert_fail("Key.size() - KeyPos >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                  ,0xf8,
                  "void ConfusableMatcher::GetMappings(const CMStringView, size_t, const CMStringView, size_t, StackVector<std::pair<size_t, size_t>> &)"
                 );
  }
  sVar4 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (sVar4 != ValuePos) {
    pbVar5 = (byte *)std::experimental::fundamentals_v1::
                     basic_string_view<char,_std::char_traits<char>_>::operator[]
                               ((basic_string_view<char,_std::char_traits<char>_> *)
                                &Value_local._M_str,KeyPos);
    bVar1 = *pbVar5;
    for (item._4_4_ = 0;
        sVar4 = std::
                vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                ::size(this->TheMap + bVar1), (ulong)(long)item._4_4_ < sVar4;
        item._4_4_ = item._4_4_ + 1) {
      foundArr.end = (pointer)std::
                              vector<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>,_std::allocator<std::pair<CMString,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>_*>_>_>
                              ::operator[](this->TheMap + bVar1,(long)item._4_4_);
      uVar9 = (((const_reference)foundArr.end)->first).Len;
      sVar4 = std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>::
              size((basic_string_view<char,_std::char_traits<char>_> *)&Value_local._M_str);
      if (uVar9 <= sVar4 - KeyPos) {
        pcVar7 = *(char **)foundArr.end;
        pcVar6 = std::experimental::fundamentals_v1::
                 basic_string_view<char,_std::char_traits<char>_>::data
                           ((basic_string_view<char,_std::char_traits<char>_> *)&Value_local._M_str)
        ;
        iVar3 = strncmp(pcVar7,pcVar6 + KeyPos,(size_t)(foundArr.end)->second);
        if (iVar3 == 0) {
          this_00 = (dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                     *)foundArr.end[1].second;
          pcVar7 = std::experimental::fundamentals_v1::
                   basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,
                              ValuePos);
          google::
          dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::find((iterator *)local_68,this_00,pcVar7);
          google::
          dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
          ::end((iterator *)&secondVec,
                (dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                 *)foundArr.end[1].second);
          bVar2 = google::
                  dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                  ::operator==((dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                                *)local_68,(iterator *)&secondVec);
          if (!bVar2) {
            ppVar8 = google::
                     dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                     ::operator->((dense_hashtable_iterator<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>,_char,_std::hash<char>,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SelectKey,_google::dense_hash_map<char,_std::vector<CMString,_std::allocator<CMString>_>_*,_std::hash<char>,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>::SetKey,_std::equal_to<char>,_google::libc_allocator_with_realloc<std::pair<const_char,_std::vector<CMString,_std::allocator<CMString>_>_*>_>_>
                                   *)local_68);
            pvStack_88 = ppVar8->second;
            for (secondItem._4_4_ = 0; uVar9 = (ulong)secondItem._4_4_,
                sVar4 = std::vector<CMString,_std::allocator<CMString>_>::size(pvStack_88),
                uVar9 < sVar4; secondItem._4_4_ = secondItem._4_4_ + 1) {
              pvStack_98 = std::vector<CMString,_std::allocator<CMString>_>::operator[]
                                     (pvStack_88,(long)secondItem._4_4_);
              uVar9 = pvStack_98->Len;
              sVar4 = std::experimental::fundamentals_v1::
                      basic_string_view<char,_std::char_traits<char>_>::size
                                ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
              if (uVar9 <= sVar4 - ValuePos) {
                pcVar7 = std::experimental::fundamentals_v1::
                         basic_string_view<char,_std::char_traits<char>_>::data
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&this_local)
                ;
                std::experimental::fundamentals_v1::basic_string_view<char,_std::char_traits<char>_>
                ::basic_string_view(&local_b0,pcVar7);
                local_c0 = CMString::View(pvStack_98);
                local_9c = StrCompareWithSkips(this,local_b0,ValuePos,local_c0);
                if (local_9c != -1) {
                  std::pair<unsigned_long,_unsigned_long>::pair<int_&,_true>
                            (&local_d0,(unsigned_long *)&(foundArr.end)->second,&local_9c);
                  StackVector<std::pair<unsigned_long,_unsigned_long>_>::Push(Storage,local_d0);
                }
              }
            }
          }
        }
      }
    }
    return;
  }
  __assert_fail("Value.size() - ValuePos >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                ,0xf9,
                "void ConfusableMatcher::GetMappings(const CMStringView, size_t, const CMStringView, size_t, StackVector<std::pair<size_t, size_t>> &)"
               );
}

Assistant:

void ConfusableMatcher::GetMappings(const CMStringView Key, size_t KeyPos, const CMStringView Value, size_t ValuePos, StackVector<std::pair<size_t, size_t>> &Storage)
{
	assert(Key.size() - KeyPos >= 1);
	assert(Value.size() - ValuePos >= 1);

	// Find array of whole keys
	const auto &vec = TheMap[(unsigned char)Key[KeyPos]];

	for (auto x = 0;x < vec.size();x++) {
		const auto &item = vec[x];

		if (item.first.Len <= Key.size() - KeyPos && strncmp(item.first.Str, Key.data() + KeyPos, item.first.Len) == 0) {
			// Whole key found, search for value array
			auto foundArr = item.second->find(Value[ValuePos]);
			if (foundArr == item.second->end())
				continue;

			const auto &secondVec = *(foundArr->second);

			for (auto i = 0;i < secondVec.size();i++) {
				const auto &secondItem = secondVec[i];

				if (secondItem.Len > Value.size() - ValuePos)
					continue;

				auto valLen = StrCompareWithSkips(Value.data(), ValuePos, secondItem.View());

				if (valLen != -1)
					Storage.Push(std::pair<size_t, size_t>((item.first).Len, valLen)); // Whole value found
			}
		}
	}
}